

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_map(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQArray *x;
  SQInteger SVar2;
  undefined1 local_38 [8];
  SQObjectPtr ret;
  SQInteger size;
  SQObject *o;
  HSQUIRRELVM v_local;
  
  pSVar1 = stack_get(v,1);
  ret.super_SQObject._unVal.nInteger = SQArray::Size((pSVar1->super_SQObject)._unVal.pArray);
  x = SQArray::Create(v->_sharedstate,ret.super_SQObject._unVal.nInteger);
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_38,x);
  SVar2 = __map_array((SQArray *)ret.super_SQObject._0_8_,(pSVar1->super_SQObject)._unVal.pArray,v);
  if (SVar2 < 0) {
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    SQVM::Push(v,(SQObjectPtr *)local_38);
    v_local = (HSQUIRRELVM)0x1;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_38);
  return (SQInteger)v_local;
}

Assistant:

static SQInteger array_map(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQInteger size = _array(o)->Size();
    SQObjectPtr ret = SQArray::Create(_ss(v),size);
    if(SQ_FAILED(__map_array(_array(ret),_array(o),v)))
        return SQ_ERROR;
    v->Push(ret);
    return 1;
}